

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void re2::AddFoldedRange(CharClassBuilder *cc,Rune lo,Rune hi,int depth)

{
  bool bVar1;
  ostream *poVar2;
  CaseFold *pCVar3;
  int *piVar4;
  Rune local_1c0;
  int local_1bc;
  Rune hi1;
  Rune lo1;
  CaseFold *f;
  LogMessage local_1a0;
  int local_1c;
  Rune local_18;
  int depth_local;
  Rune hi_local;
  Rune lo_local;
  CharClassBuilder *cc_local;
  
  local_1c = depth;
  local_18 = hi;
  depth_local = lo;
  _hi_local = cc;
  if (depth < 0xb) {
    bVar1 = CharClassBuilder::AddRange(cc,lo,hi);
    if (bVar1) {
      while ((depth_local <= local_18 &&
             (pCVar3 = LookupCaseFold((CaseFold *)unicode_casefold,0x13a,depth_local),
             local_1bc = depth_local, pCVar3 != (CaseFold *)0x0))) {
        if (depth_local < pCVar3->lo) {
          depth_local = pCVar3->lo;
        }
        else {
          piVar4 = std::min<int>(&local_18,&pCVar3->hi);
          local_1c0 = *piVar4;
          if (pCVar3->delta == -1) {
            if (local_1bc % 2 == 0) {
              local_1bc = local_1bc + -1;
            }
            if (local_1c0 % 2 == 1) {
              local_1c0 = local_1c0 + 1;
            }
          }
          else if (pCVar3->delta == 1) {
            if (local_1bc % 2 == 1) {
              local_1bc = local_1bc + -1;
            }
            if (local_1c0 % 2 == 0) {
              local_1c0 = local_1c0 + 1;
            }
          }
          else {
            local_1bc = pCVar3->delta + local_1bc;
            local_1c0 = pCVar3->delta + local_1c0;
          }
          AddFoldedRange(_hi_local,local_1bc,local_1c0,local_1c + 1);
          depth_local = pCVar3->hi + 1;
        }
      }
    }
  }
  else {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/parse.cc",0x14a
              );
    poVar2 = LogMessage::stream(&local_1a0);
    std::operator<<(poVar2,"AddFoldedRange recurses too much.");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  return;
}

Assistant:

static void AddFoldedRange(CharClassBuilder* cc, Rune lo, Rune hi, int depth) {
  // AddFoldedRange calls itself recursively for each rune in the fold cycle.
  // Most folding cycles are small: there aren't any bigger than four in the
  // current Unicode tables.  make_unicode_casefold.py checks that
  // the cycles are not too long, and we double-check here using depth.
  if (depth > 10) {
    LOG(DFATAL) << "AddFoldedRange recurses too much.";
    return;
  }

  if (!cc->AddRange(lo, hi))  // lo-hi was already there? we're done
    return;

  while (lo <= hi) {
    const CaseFold* f = LookupCaseFold(unicode_casefold, num_unicode_casefold, lo);
    if (f == NULL)  // lo has no fold, nor does anything above lo
      break;
    if (lo < f->lo) {  // lo has no fold; next rune with a fold is f->lo
      lo = f->lo;
      continue;
    }

    // Add in the result of folding the range lo - f->hi
    // and that range's fold, recursively.
    Rune lo1 = lo;
    Rune hi1 = min<Rune>(hi, f->hi);
    switch (f->delta) {
      default:
        lo1 += f->delta;
        hi1 += f->delta;
        break;
      case EvenOdd:
        if (lo1%2 == 1)
          lo1--;
        if (hi1%2 == 0)
          hi1++;
        break;
      case OddEven:
        if (lo1%2 == 0)
          lo1--;
        if (hi1%2 == 1)
          hi1++;
        break;
    }
    AddFoldedRange(cc, lo1, hi1, depth+1);

    // Pick up where this fold left off.
    lo = f->hi + 1;
  }
}